

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::ConvectiveScalMinMax
          (NavierStokesBase *this,MultiFab *Snew,int snew_comp,MultiFab *Sold,int sold_comp)

{
  double dVar1;
  long lVar2;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int kk;
  long lVar7;
  long lVar8;
  int jj;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  MFIter mfi;
  long local_220;
  long local_218;
  long local_200;
  long local_1f8;
  long local_1e0;
  long local_1d8;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)Snew,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_16c,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&Snew->super_FabArray<amrex::FArrayBox>,&local_90,snew_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&Sold->super_FabArray<amrex::FArrayBox>,&local_90,sold_comp);
      lVar2 = __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (lVar2 == 0) {
        __cxa_bad_cast();
      }
      this_00 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar2 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,this_00,&local_90);
      local_220 = (long)local_16c.smallend.vect[2];
      if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
        lVar7 = (long)local_16c.smallend.vect[1];
        lVar11 = local_110.jstride * 8;
        lVar12 = local_110.kstride * 8;
        lVar14 = (long)local_16c.smallend.vect[0];
        lVar2 = local_150.jstride * 8;
        lVar10 = local_150.kstride * 8;
        local_1f8 = ((local_220 + -1) - (long)local_110.begin.z) * lVar12 +
                    ((lVar7 - local_110.begin.y) + -1) * lVar11 + lVar14 * 8 +
                    (long)local_110.begin.x * -8 + (long)local_110.p;
        local_200 = ((local_220 + -1) - (long)local_150.begin.z) * lVar10 +
                    ((lVar7 - local_150.begin.y) + -1) * lVar2 + lVar14 * 8 +
                    (long)local_150.begin.x * -8 + (long)local_150.p;
        do {
          if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
            lVar3 = (local_220 - local_d0.begin.z) * local_d0.kstride;
            local_1d8 = local_200;
            local_1e0 = local_1f8;
            local_218 = lVar7;
            do {
              if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                lVar4 = (local_218 - local_d0.begin.y) * local_d0.jstride;
                lVar15 = local_1e0;
                lVar16 = local_1d8;
                lVar19 = lVar14;
                do {
                  lVar8 = -1;
                  dVar20 = 2.2250738585072014e-308;
                  dVar22 = 1.79769313486232e+308;
                  lVar5 = lVar16;
                  lVar17 = lVar15;
                  do {
                    lVar9 = -1;
                    lVar13 = lVar5;
                    lVar18 = lVar17;
                    do {
                      lVar6 = -1;
                      dVar21 = dVar20;
                      do {
                        dVar20 = dVar21;
                        if (0.0 < *(double *)(lVar13 + lVar6 * 8)) {
                          dVar20 = *(double *)(lVar18 + lVar6 * 8);
                          dVar1 = dVar20;
                          if (dVar22 <= dVar20) {
                            dVar1 = dVar22;
                          }
                          dVar22 = dVar1;
                          if (dVar20 <= dVar21) {
                            dVar20 = dVar21;
                          }
                        }
                        lVar6 = lVar6 + 1;
                        dVar21 = dVar20;
                      } while (lVar6 != 2);
                      lVar9 = lVar9 + 1;
                      lVar18 = lVar18 + lVar11;
                      lVar13 = lVar13 + lVar2;
                    } while (lVar9 != 2);
                    lVar8 = lVar8 + 1;
                    lVar17 = lVar17 + lVar12;
                    lVar5 = lVar5 + lVar10;
                  } while (lVar8 != 2);
                  if (dVar22 <= local_d0.p[lVar3 + lVar4 + (lVar19 - local_d0.begin.x)]) {
                    dVar22 = local_d0.p[lVar3 + lVar4 + (lVar19 - local_d0.begin.x)];
                  }
                  if (dVar22 <= dVar20) {
                    dVar20 = dVar22;
                  }
                  local_d0.p[lVar3 + lVar4 + (lVar19 - local_d0.begin.x)] = dVar20;
                  lVar19 = lVar19 + 1;
                  lVar15 = lVar15 + 8;
                  lVar16 = lVar16 + 8;
                } while (local_16c.bigend.vect[0] + 1 != (int)lVar19);
              }
              local_218 = local_218 + 1;
              local_1e0 = local_1e0 + lVar11;
              local_1d8 = local_1d8 + lVar2;
            } while (local_16c.bigend.vect[1] + 1 != (int)local_218);
          }
          local_220 = local_220 + 1;
          local_1f8 = local_1f8 + lVar12;
          local_200 = local_200 + lVar10;
        } while (local_16c.bigend.vect[2] + 1 != (int)local_220);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
NavierStokesBase::ConvectiveScalMinMax ( amrex::MultiFab&       Snew, const int snew_comp,
                                         amrex::MultiFab const& Sold, const int sold_comp )
{

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const auto& bx = mfi.tilebox();

        const auto& sn   = Snew.array(mfi,snew_comp);
        const auto& so   = Sold.const_array(mfi,sold_comp);
#ifdef AMREX_USE_EB
        const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
        const auto& vfrac = ebfactory.getVolFrac().const_array(mfi);
#endif

        amrex::ParallelFor(bx, [=]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real smn = std::numeric_limits<Real>::max();
            Real smx = std::numeric_limits<Real>::min();

#if (AMREX_SPACEDIM==3)
            int ks = -1;
            int ke =  1;
#else
            int ks = 0;
            int ke = 0;
#endif

            for (int kk = ks; kk <= ke; ++kk)
            {
                for (int jj = -1; jj <= 1; ++jj)
                {
                    for (int ii = -1; ii <= 1; ++ii)
                    {
#ifdef AMREX_USE_EB
                        if ( vfrac (i+ii,j+jj,k+kk) > 0. )
#endif
                        {
                            smn =  amrex::min(smn, so(i+ii,j+jj,k+kk));
                            smx =  amrex::max(smx, so(i+ii,j+jj,k+kk));
                        }
                    }
                }
            }
            sn(i,j,k) = amrex::min( amrex::max(sn(i,j,k), smn), smx );
        });
    }
}